

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4.c
# Opt level: O3

void * body(MD4_CTX *ctx,void *data,unsigned_long size)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  MD4_u32plus MVar18;
  uint uVar19;
  MD4_u32plus MVar20;
  uint uVar21;
  MD4_u32plus MVar22;
  uint uVar23;
  MD4_u32plus MVar24;
  
  MVar18 = ctx->a;
  MVar24 = ctx->b;
  MVar22 = ctx->c;
  MVar20 = ctx->d;
  do {
    iVar1 = *data;
    iVar2 = *(int *)((long)data + 4);
    uVar17 = ((MVar20 ^ MVar22) & MVar24 ^ MVar20) + MVar18 + iVar1;
    uVar17 = uVar17 * 8 | uVar17 >> 0x1d;
    uVar19 = ((MVar24 ^ MVar22) & uVar17 ^ MVar22) + MVar20 + iVar2;
    uVar19 = uVar19 * 0x80 | uVar19 >> 0x19;
    iVar3 = *(int *)((long)data + 8);
    uVar21 = ((uVar17 ^ MVar24) & uVar19 ^ MVar24) + iVar3 + MVar22;
    uVar21 = uVar21 * 0x800 | uVar21 >> 0x15;
    iVar4 = *(int *)((long)data + 0xc);
    uVar23 = ((uVar19 ^ uVar17) & uVar21 ^ uVar17) + iVar4 + MVar24;
    uVar23 = uVar23 * 0x80000 | uVar23 >> 0xd;
    iVar5 = *(int *)((long)data + 0x10);
    uVar17 = uVar17 + iVar5 + ((uVar21 ^ uVar19) & uVar23 ^ uVar19);
    uVar17 = uVar17 * 8 | uVar17 >> 0x1d;
    iVar6 = *(int *)((long)data + 0x14);
    uVar19 = uVar19 + iVar6 + ((uVar23 ^ uVar21) & uVar17 ^ uVar21);
    uVar19 = uVar19 * 0x80 | uVar19 >> 0x19;
    iVar7 = *(int *)((long)data + 0x18);
    uVar21 = uVar21 + iVar7 + ((uVar17 ^ uVar23) & uVar19 ^ uVar23);
    uVar21 = uVar21 * 0x800 | uVar21 >> 0x15;
    iVar8 = *(int *)((long)data + 0x1c);
    uVar23 = uVar23 + iVar8 + ((uVar19 ^ uVar17) & uVar21 ^ uVar17);
    uVar23 = uVar23 * 0x80000 | uVar23 >> 0xd;
    iVar9 = *(int *)((long)data + 0x20);
    uVar17 = uVar17 + iVar9 + ((uVar21 ^ uVar19) & uVar23 ^ uVar19);
    uVar17 = uVar17 * 8 | uVar17 >> 0x1d;
    iVar10 = *(int *)((long)data + 0x24);
    uVar19 = uVar19 + iVar10 + ((uVar23 ^ uVar21) & uVar17 ^ uVar21);
    uVar19 = uVar19 * 0x80 | uVar19 >> 0x19;
    iVar11 = *(int *)((long)data + 0x28);
    uVar21 = uVar21 + iVar11 + ((uVar17 ^ uVar23) & uVar19 ^ uVar23);
    uVar21 = uVar21 * 0x800 | uVar21 >> 0x15;
    iVar12 = *(int *)((long)data + 0x2c);
    uVar23 = uVar23 + iVar12 + ((uVar19 ^ uVar17) & uVar21 ^ uVar17);
    uVar23 = uVar23 * 0x80000 | uVar23 >> 0xd;
    iVar13 = *(int *)((long)data + 0x30);
    uVar17 = uVar17 + iVar13 + ((uVar21 ^ uVar19) & uVar23 ^ uVar19);
    uVar17 = uVar17 * 8 | uVar17 >> 0x1d;
    iVar14 = *(int *)((long)data + 0x34);
    uVar19 = uVar19 + iVar14 + ((uVar23 ^ uVar21) & uVar17 ^ uVar21);
    uVar19 = uVar19 * 0x80 | uVar19 >> 0x19;
    iVar15 = *(int *)((long)data + 0x38);
    uVar21 = uVar21 + iVar15 + ((uVar17 ^ uVar23) & uVar19 ^ uVar23);
    uVar21 = uVar21 * 0x800 | uVar21 >> 0x15;
    iVar16 = *(int *)((long)data + 0x3c);
    uVar23 = uVar23 + iVar16 + ((uVar19 ^ uVar17) & uVar21 ^ uVar17);
    uVar23 = uVar23 * 0x80000 | uVar23 >> 0xd;
    uVar17 = uVar17 + iVar1 + 0x5a827999 + (uVar21 & uVar19 | (uVar21 | uVar19) & uVar23);
    uVar17 = uVar17 * 8 | uVar17 >> 0x1d;
    uVar19 = uVar19 + iVar5 + 0x5a827999 + (uVar23 & uVar21 | (uVar23 | uVar21) & uVar17);
    uVar19 = uVar19 * 0x20 | uVar19 >> 0x1b;
    uVar21 = uVar21 + iVar9 + 0x5a827999 + (uVar17 & uVar23 | (uVar17 | uVar23) & uVar19);
    uVar21 = uVar21 * 0x200 | uVar21 >> 0x17;
    uVar23 = uVar23 + iVar13 + 0x5a827999 + (uVar19 & uVar17 | (uVar19 | uVar17) & uVar21);
    uVar23 = uVar23 * 0x2000 | uVar23 >> 0x13;
    uVar17 = uVar17 + iVar2 + 0x5a827999 + (uVar21 & uVar19 | (uVar21 | uVar19) & uVar23);
    uVar17 = uVar17 * 8 | uVar17 >> 0x1d;
    uVar19 = uVar19 + iVar6 + 0x5a827999 + (uVar23 & uVar21 | (uVar23 | uVar21) & uVar17);
    uVar19 = uVar19 * 0x20 | uVar19 >> 0x1b;
    uVar21 = uVar21 + iVar10 + 0x5a827999 + (uVar17 & uVar23 | (uVar17 | uVar23) & uVar19);
    uVar21 = uVar21 * 0x200 | uVar21 >> 0x17;
    uVar23 = uVar23 + iVar14 + 0x5a827999 + (uVar19 & uVar17 | (uVar19 | uVar17) & uVar21);
    uVar23 = uVar23 * 0x2000 | uVar23 >> 0x13;
    uVar17 = uVar17 + iVar3 + 0x5a827999 + (uVar21 & uVar19 | (uVar21 | uVar19) & uVar23);
    uVar17 = uVar17 * 8 | uVar17 >> 0x1d;
    uVar19 = uVar19 + iVar7 + 0x5a827999 + (uVar23 & uVar21 | (uVar23 | uVar21) & uVar17);
    uVar19 = uVar19 * 0x20 | uVar19 >> 0x1b;
    uVar21 = uVar21 + iVar11 + 0x5a827999 + (uVar17 & uVar23 | (uVar17 | uVar23) & uVar19);
    uVar21 = uVar21 * 0x200 | uVar21 >> 0x17;
    uVar23 = uVar23 + iVar15 + 0x5a827999 + (uVar19 & uVar17 | (uVar19 | uVar17) & uVar21);
    uVar23 = uVar23 * 0x2000 | uVar23 >> 0x13;
    uVar17 = uVar17 + iVar4 + 0x5a827999 + (uVar21 & uVar19 | (uVar21 | uVar19) & uVar23);
    uVar17 = uVar17 * 8 | uVar17 >> 0x1d;
    uVar19 = uVar19 + iVar8 + 0x5a827999 + (uVar23 & uVar21 | (uVar23 | uVar21) & uVar17);
    uVar19 = uVar19 * 0x20 | uVar19 >> 0x1b;
    uVar21 = uVar21 + iVar12 + 0x5a827999 + (uVar17 & uVar23 | (uVar17 | uVar23) & uVar19);
    uVar21 = uVar21 * 0x200 | uVar21 >> 0x17;
    uVar23 = uVar23 + iVar16 + 0x5a827999 + (uVar19 & uVar17 | (uVar19 | uVar17) & uVar21);
    uVar23 = uVar23 * 0x2000 | uVar23 >> 0x13;
    uVar17 = uVar17 + iVar1 + 0x6ed9eba1 + (uVar23 ^ uVar21 ^ uVar19);
    uVar17 = uVar17 * 8 | uVar17 >> 0x1d;
    uVar19 = uVar19 + iVar9 + 0x6ed9eba1 + (uVar23 ^ uVar21 ^ uVar17);
    uVar19 = uVar19 * 0x200 | uVar19 >> 0x17;
    uVar21 = uVar21 + iVar5 + 0x6ed9eba1 + (uVar17 ^ uVar23 ^ uVar19);
    uVar21 = uVar21 * 0x800 | uVar21 >> 0x15;
    uVar23 = uVar23 + iVar13 + 0x6ed9eba1 + (uVar19 ^ uVar17 ^ uVar21);
    uVar23 = uVar23 * 0x8000 | uVar23 >> 0x11;
    uVar17 = uVar17 + iVar3 + 0x6ed9eba1 + (uVar21 ^ uVar19 ^ uVar23);
    uVar17 = uVar17 * 8 | uVar17 >> 0x1d;
    uVar19 = uVar19 + iVar11 + 0x6ed9eba1 + (uVar23 ^ uVar21 ^ uVar17);
    uVar19 = uVar19 * 0x200 | uVar19 >> 0x17;
    uVar21 = uVar21 + iVar7 + 0x6ed9eba1 + (uVar17 ^ uVar23 ^ uVar19);
    uVar21 = uVar21 * 0x800 | uVar21 >> 0x15;
    uVar23 = uVar23 + iVar15 + 0x6ed9eba1 + (uVar19 ^ uVar17 ^ uVar21);
    uVar23 = uVar23 * 0x8000 | uVar23 >> 0x11;
    uVar17 = uVar17 + iVar2 + 0x6ed9eba1 + (uVar21 ^ uVar19 ^ uVar23);
    uVar17 = uVar17 * 8 | uVar17 >> 0x1d;
    uVar19 = uVar19 + iVar10 + 0x6ed9eba1 + (uVar23 ^ uVar21 ^ uVar17);
    uVar19 = uVar19 * 0x200 | uVar19 >> 0x17;
    uVar21 = uVar21 + iVar6 + 0x6ed9eba1 + (uVar17 ^ uVar23 ^ uVar19);
    uVar21 = uVar21 * 0x800 | uVar21 >> 0x15;
    uVar23 = uVar23 + iVar14 + 0x6ed9eba1 + (uVar19 ^ uVar17 ^ uVar21);
    uVar23 = uVar23 * 0x8000 | uVar23 >> 0x11;
    uVar17 = uVar17 + iVar4 + 0x6ed9eba1 + (uVar21 ^ uVar19 ^ uVar23);
    uVar17 = uVar17 * 8 | uVar17 >> 0x1d;
    uVar19 = uVar19 + iVar12 + 0x6ed9eba1 + (uVar23 ^ uVar21 ^ uVar17);
    uVar19 = uVar19 * 0x200 | uVar19 >> 0x17;
    uVar21 = uVar21 + iVar8 + 0x6ed9eba1 + (uVar17 ^ uVar23 ^ uVar19);
    uVar21 = uVar21 * 0x800 | uVar21 >> 0x15;
    uVar23 = uVar23 + iVar16 + 0x6ed9eba1 + (uVar19 ^ uVar17 ^ uVar21);
    MVar18 = uVar17 + MVar18;
    MVar24 = (uVar23 * 0x8000 | uVar23 >> 0x11) + MVar24;
    MVar22 = uVar21 + MVar22;
    MVar20 = uVar19 + MVar20;
    data = (void *)((long)data + 0x40);
    size = size - 0x40;
  } while (size != 0);
  ctx->a = MVar18;
  ctx->b = MVar24;
  ctx->c = MVar22;
  ctx->d = MVar20;
  return data;
}

Assistant:

static const void *body(MD4_CTX *ctx, const void *data, unsigned long size)
{
  const unsigned char *ptr;
  MD4_u32plus a, b, c, d;

  ptr = (const unsigned char *)data;

  a = ctx->a;
  b = ctx->b;
  c = ctx->c;
  d = ctx->d;

  do {
    MD4_u32plus saved_a, saved_b, saved_c, saved_d;

    saved_a = a;
    saved_b = b;
    saved_c = c;
    saved_d = d;

/* Round 1 */
    STEP(F, a, b, c, d, SET(0), 3)
    STEP(F, d, a, b, c, SET(1), 7)
    STEP(F, c, d, a, b, SET(2), 11)
    STEP(F, b, c, d, a, SET(3), 19)
    STEP(F, a, b, c, d, SET(4), 3)
    STEP(F, d, a, b, c, SET(5), 7)
    STEP(F, c, d, a, b, SET(6), 11)
    STEP(F, b, c, d, a, SET(7), 19)
    STEP(F, a, b, c, d, SET(8), 3)
    STEP(F, d, a, b, c, SET(9), 7)
    STEP(F, c, d, a, b, SET(10), 11)
    STEP(F, b, c, d, a, SET(11), 19)
    STEP(F, a, b, c, d, SET(12), 3)
    STEP(F, d, a, b, c, SET(13), 7)
    STEP(F, c, d, a, b, SET(14), 11)
    STEP(F, b, c, d, a, SET(15), 19)

/* Round 2 */
    STEP(G, a, b, c, d, GET(0) + 0x5a827999, 3)
    STEP(G, d, a, b, c, GET(4) + 0x5a827999, 5)
    STEP(G, c, d, a, b, GET(8) + 0x5a827999, 9)
    STEP(G, b, c, d, a, GET(12) + 0x5a827999, 13)
    STEP(G, a, b, c, d, GET(1) + 0x5a827999, 3)
    STEP(G, d, a, b, c, GET(5) + 0x5a827999, 5)
    STEP(G, c, d, a, b, GET(9) + 0x5a827999, 9)
    STEP(G, b, c, d, a, GET(13) + 0x5a827999, 13)
    STEP(G, a, b, c, d, GET(2) + 0x5a827999, 3)
    STEP(G, d, a, b, c, GET(6) + 0x5a827999, 5)
    STEP(G, c, d, a, b, GET(10) + 0x5a827999, 9)
    STEP(G, b, c, d, a, GET(14) + 0x5a827999, 13)
    STEP(G, a, b, c, d, GET(3) + 0x5a827999, 3)
    STEP(G, d, a, b, c, GET(7) + 0x5a827999, 5)
    STEP(G, c, d, a, b, GET(11) + 0x5a827999, 9)
    STEP(G, b, c, d, a, GET(15) + 0x5a827999, 13)

/* Round 3 */
    STEP(H, a, b, c, d, GET(0) + 0x6ed9eba1, 3)
    STEP(H, d, a, b, c, GET(8) + 0x6ed9eba1, 9)
    STEP(H, c, d, a, b, GET(4) + 0x6ed9eba1, 11)
    STEP(H, b, c, d, a, GET(12) + 0x6ed9eba1, 15)
    STEP(H, a, b, c, d, GET(2) + 0x6ed9eba1, 3)
    STEP(H, d, a, b, c, GET(10) + 0x6ed9eba1, 9)
    STEP(H, c, d, a, b, GET(6) + 0x6ed9eba1, 11)
    STEP(H, b, c, d, a, GET(14) + 0x6ed9eba1, 15)
    STEP(H, a, b, c, d, GET(1) + 0x6ed9eba1, 3)
    STEP(H, d, a, b, c, GET(9) + 0x6ed9eba1, 9)
    STEP(H, c, d, a, b, GET(5) + 0x6ed9eba1, 11)
    STEP(H, b, c, d, a, GET(13) + 0x6ed9eba1, 15)
    STEP(H, a, b, c, d, GET(3) + 0x6ed9eba1, 3)
    STEP(H, d, a, b, c, GET(11) + 0x6ed9eba1, 9)
    STEP(H, c, d, a, b, GET(7) + 0x6ed9eba1, 11)
    STEP(H, b, c, d, a, GET(15) + 0x6ed9eba1, 15)

    a += saved_a;
    b += saved_b;
    c += saved_c;
    d += saved_d;

    ptr += 64;
  } while(size -= 64);

  ctx->a = a;
  ctx->b = b;
  ctx->c = c;
  ctx->d = d;

  return ptr;
}